

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O3

vec_t ImGuizmo::Cross(vec_t *v1,vec_t *v2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec_t vVar5;
  
  uVar1 = v2->x;
  uVar3 = v2->y;
  uVar2 = v1->x;
  uVar4 = v1->y;
  vVar5.x = (float)uVar4 * v2->z - (float)uVar3 * v1->z;
  vVar5.y = v1->z * (float)uVar1 - v2->z * (float)uVar2;
  vVar5.z = (float)uVar2 * (float)uVar3 - (float)uVar1 * (float)uVar4;
  vVar5.w = 0.0;
  return vVar5;
}

Assistant:

vec_t Cross(const vec_t& v1, const vec_t& v2)
   {
      vec_t res;
      res.x = v1.y * v2.z - v1.z * v2.y;
      res.y = v1.z * v2.x - v1.x * v2.z;
      res.z = v1.x * v2.y - v1.y * v2.x;
      res.w = 0.f;
      return res;
   }